

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildProfiled2CallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,ProfileId profileId2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JITTimeProfileInfo *this_00;
  Opnd *pOVar4;
  JitProfilingInstr *pJVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Instr *local_40;
  Instr *callInstr;
  ArrayCallSiteInfo *arrayCallSiteInfo;
  ProfileId local_26;
  TypeId arrayTypeId;
  RegSlot RStack_20;
  ProfileId useProfileId;
  OpCode useOpcode;
  ArgSlot argCount_local;
  RegSlot function_local;
  RegSlot returnValue_local;
  uint32 offset_local;
  OpCode opcode_local;
  IRBuilder *this_local;
  
  arrayTypeId._2_2_ = argCount;
  RStack_20 = function;
  _useOpcode = returnValue;
  function_local = offset;
  returnValue_local._2_2_ = opcode;
  _offset_local = this;
  if ((opcode != ProfiledNewScObjArray) && (opcode != ProfiledNewScObjArraySpread)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19c3,
                       "(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread)"
                       ,
                       "opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&returnValue_local + 2));
  arrayTypeId._0_2_ = returnValue_local._2_2_;
  local_26 = profileId2;
  arrayCallSiteInfo._4_4_ = TypeIds_Array;
  if (_useOpcode == 0xffffffff) {
    arrayTypeId._0_2_ = 0xc4;
    if (returnValue_local._2_2_ == NewScObjArraySpread) {
      arrayTypeId._0_2_ = 0x160;
    }
    local_26 = profileId;
  }
  else {
    callInstr = (Instr *)0x0;
    bVar2 = Func::HasArrayInfo(this->m_func);
    if (bVar2) {
      this_00 = Func::GetReadOnlyProfileInfo(this->m_func);
      callInstr = (Instr *)JITTimeProfileInfo::GetArrayCallSiteInfo(this_00,profileId2);
    }
    if ((callInstr == (Instr *)0x0) || (bVar2 = Func::IsJitInDebugMode(this->m_func), bVar2)) {
      arrayTypeId._0_2_ = 0xc4;
      if (returnValue_local._2_2_ == NewScObjArraySpread) {
        arrayTypeId._0_2_ = 0x160;
      }
      local_26 = profileId;
    }
    else {
      bVar2 = Js::ArrayCallSiteInfo::IsNativeIntArray((ArrayCallSiteInfo *)callInstr);
      if (bVar2) {
        arrayCallSiteInfo._4_4_ = TypeIds_NativeIntArray;
      }
      else {
        bVar2 = Js::ArrayCallSiteInfo::IsNativeFloatArray((ArrayCallSiteInfo *)callInstr);
        if (bVar2) {
          arrayCallSiteInfo._4_4_ = TypeIds_ArrayLast;
        }
      }
    }
  }
  local_40 = BuildCallI_Helper(this,(undefined2)arrayTypeId,function_local,_useOpcode,RStack_20,
                               arrayTypeId._2_2_,local_26,CallFlags_None,0xffffffff);
  pOVar4 = IR::Instr::GetDst(local_40);
  if (pOVar4 != (Opnd *)0x0) {
    pOVar4 = IR::Instr::GetDst(local_40);
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_48.field_0);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_46.field_0,true);
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)&local_44.field_0,arrayCallSiteInfo._4_4_);
    IR::Opnd::SetValueType(pOVar4,(ValueType)local_42.field_0);
  }
  bVar2 = IR::Instr::IsJitProfilingInstr(local_40);
  if (bVar2) {
    pJVar5 = IR::Instr::AsJitProfilingInstr(local_40);
    pJVar5->field_0x60 = pJVar5->field_0x60 & 0xfb | 4;
    pJVar5 = IR::Instr::AsJitProfilingInstr(local_40);
    pJVar5->arrayProfileId = profileId2;
    pJVar5 = IR::Instr::AsJitProfilingInstr(local_40);
    if (pJVar5->profileId != profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x19f5,"(callInstr->AsJitProfilingInstr()->profileId == profileId)",
                         "callInstr->AsJitProfilingInstr()->profileId == profileId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiled2CallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::ProfileId profileId2)
{
    Assert(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(opcode);

    Js::OpCode useOpcode = opcode;
    // We either want to provide the array profile id (profileId2) to the native array creation or the call profileid (profileId)
    //     to the call to NewScObject
    Js::ProfileId useProfileId = profileId2;
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (returnValue != Js::Constants::NoRegister)
    {
        Js::ArrayCallSiteInfo *arrayCallSiteInfo = nullptr;
        if (m_func->HasArrayInfo())
        {
            arrayCallSiteInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId2);
        }
        if (arrayCallSiteInfo && !m_func->IsJitInDebugMode())
        {
            if (arrayCallSiteInfo->IsNativeIntArray())
            {
                arrayTypeId = Js::TypeIds_NativeIntArray;
            }
            else if (arrayCallSiteInfo->IsNativeFloatArray())
            {
                arrayTypeId = Js::TypeIds_NativeFloatArray;
            }
        }
        else
        {
            useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            useProfileId = profileId;
        }
    }
    else
    {
        useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
        useProfileId = profileId;
    }
    IR::Instr * callInstr = BuildCallI_Helper(useOpcode, offset, returnValue, function, argCount, useProfileId);
    if (callInstr->GetDst())
    {
        callInstr->GetDst()->SetValueType(
            ValueType::GetObject(ObjectType::Array).ToLikely().SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    }
    if (callInstr->IsJitProfilingInstr())
    {
        // If we happened to decide in BuildCallI_Helper that this should be a jit profiling instr, then save the fact that it is
        //    a "new Array(args, ...)" call and also save the array profile id (profileId2)
        callInstr->AsJitProfilingInstr()->isNewArray = true;
        callInstr->AsJitProfilingInstr()->arrayProfileId = profileId2;
        // Double check that this profileId made it to the JitProfilingInstr like we expect it to.
        Assert(callInstr->AsJitProfilingInstr()->profileId == profileId);
    }
}